

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

bool __thiscall VulkanHppGenerator::isVectorByStructure(VulkanHppGenerator *this,string *type)

{
  bool bVar1;
  pointer ppVar2;
  bool local_66;
  allocator<char> local_51;
  string local_50;
  _Self local_30;
  _Self local_28;
  const_iterator structIt;
  string *type_local;
  VulkanHppGenerator *this_local;
  
  structIt._M_node = (_Base_ptr)type;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
       ::find(&this->m_structs,type);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>_>
       ::end(&this->m_structs);
  bVar1 = std::operator==(&local_28,&local_30);
  local_66 = false;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>_>
             ::operator->(&local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    local_66 = describesVector(this,&ppVar2->second,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return local_66;
}

Assistant:

bool VulkanHppGenerator::isVectorByStructure( std::string const & type ) const
{
  auto structIt = m_structs.find( type );
  return ( structIt != m_structs.end() ) && describesVector( structIt->second );
}